

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::apps::Clone::getMessage(Clone *this,int index)

{
  int in_EDX;
  undefined4 in_register_00000034;
  
  if ((in_EDX < 0) ||
     ((int)((ulong)(*(long *)(CONCAT44(in_register_00000034,index) + 0x148) -
                   *(long *)(CONCAT44(in_register_00000034,index) + 0x140)) >> 3) <= in_EDX)) {
    (this->super_App)._vptr_App = (_func_int **)0x0;
  }
  else {
    std::make_unique<helics::Message,helics::Message&>((Message *)this);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> Clone::getMessage(int index) const
{
    if (isValidIndex(index, messages)) {
        return std::make_unique<Message>(*messages[index]);
    }
    return nullptr;
}